

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O2

int __thiscall caldate_t::iso_weekno(caldate_t *this,int *year)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  caldate_t jan1;
  caldate_t this_thu;
  
  iVar1 = iso_weekday(this);
  iVar2 = dayno(this);
  iVar1 = (iVar2 - iVar1) + 4;
  set_dayno(&this_thu,iVar1);
  if (year != (int *)0x0) {
    *year = this_thu.y;
  }
  jan1.y = this_thu.y;
  jan1.m = 1;
  jan1.d = 1;
  iVar3 = weekday(&jan1);
  iVar2 = dayno(&jan1);
  return (iVar1 - ((0xb - iVar3) % 7 + iVar2)) / 7 + 1;
}

Assistant:

int iso_weekno(int *year) const
    {
        /* 
         *   Find the Thursday of the current ISO week.  To do this, figure
         *   our weekday, subtract the ISO weekday number minus 1 to get the
         *   nearest preceding Monday (the start of the ISO week), then add 3
         *   to get the following Thursday.  The year containing the Thursday
         *   of a given week is by definition the year which that whole week
         *   (starting on Monday) belongs to.
         */
        int wday = iso_weekday();
        int32_t this_thu_dayno = dayno() - (wday-1) + 3;
        caldate_t this_thu(this_thu_dayno);

        /* the year containing the Thursday is the week's calendar year */
        if (year != 0)
            *year = this_thu.y;

        /*
         *   Find the first Thursday of the calendar year we just calculated.
         *   ISO week 1 of a given calendar year is the week that contains
         *   the first Thursday of the year.  So find the first Thursday on
         *   or after Jan 1.
         */
        caldate_t jan1(this_thu.y, 1, 1);
        int jan1_wday = jan1.weekday();
        int32_t first_thu_dayno = jan1.dayno() + ((11 - jan1_wday) % 7);

        /*
         *   Calculate the number of weeks (== the number of days divided by
         *   seven) between the Thursday of the target week and the Thursday
         *   of the first week.  This gives us the difference in week
         *   numbers; since the first week is week #1, adding 1 to the
         *   difference gives us the target week number.
         */
        return ((this_thu_dayno - first_thu_dayno)/7) + 1;
    }